

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timestamp.cpp
# Opt level: O0

Timestamp * __thiscall
sznet::Timestamp::toFormattedString_abi_cxx11_(Timestamp *this,bool showMicroseconds)

{
  byte in_DL;
  undefined7 in_register_00000031;
  allocator local_8d;
  undefined4 local_8c;
  undefined1 local_88 [4];
  int microseconds;
  tm tm_time;
  time_t seconds;
  char buf [32];
  bool showMicroseconds_local;
  Timestamp *this_local;
  
  buf[0x1f] = in_DL & 1;
  memset(&seconds,0,0x20);
  tm_time.tm_zone = (char *)(*(long *)CONCAT71(in_register_00000031,showMicroseconds) / 1000000);
  sz_localtime((tm *)local_88,(time_t)tm_time.tm_zone);
  if ((buf[0x1f] & 1U) == 0) {
    snprintf((char *)&seconds,0x20,"%4d%02d%02d %02d:%02d:%02d",(ulong)(tm_time.tm_mday + 0x76c),
             (ulong)(tm_time.tm_hour + 1),(ulong)(uint)tm_time.tm_min,tm_time.tm_sec,microseconds,
             local_88);
  }
  else {
    local_8c = (undefined4)(*(long *)CONCAT71(in_register_00000031,showMicroseconds) % 1000000);
    snprintf((char *)&seconds,0x20,"%4d%02d%02d %02d:%02d:%02d.%06d",
             (ulong)(tm_time.tm_mday + 0x76c),(ulong)(tm_time.tm_hour + 1),
             (ulong)(uint)tm_time.tm_min,tm_time.tm_sec,microseconds,local_88,local_8c);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,(char *)&seconds,&local_8d);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d);
  return this;
}

Assistant:

string Timestamp::toFormattedString(bool showMicroseconds) const
{
	char buf[32] = { 0 };
	time_t seconds = static_cast<time_t>(m_microSecondsSinceEpoch / kMicroSecondsPerSecond);
	struct tm tm_time;
	sz_localtime(tm_time, seconds);

	if (showMicroseconds)
	{
		int microseconds = static_cast<int>(m_microSecondsSinceEpoch % kMicroSecondsPerSecond);
		snprintf(buf, sizeof(buf), "%4d%02d%02d %02d:%02d:%02d.%06d",
			tm_time.tm_year + 1900, tm_time.tm_mon + 1, tm_time.tm_mday,
			tm_time.tm_hour, tm_time.tm_min, tm_time.tm_sec,
			microseconds);
	}
	else
	{
		snprintf(buf, sizeof(buf), "%4d%02d%02d %02d:%02d:%02d",
			tm_time.tm_year + 1900, tm_time.tm_mon + 1, tm_time.tm_mday,
			tm_time.tm_hour, tm_time.tm_min, tm_time.tm_sec);
	}

	return buf;
}